

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O3

void __thiscall
FIX::SessionFactory::processFixtDataDictionaries
          (SessionFactory *this,SessionID *sessionID,Dictionary *settings,
          DataDictionaryProvider *provider)

{
  _Rb_tree_node_base *__rhs;
  _Base_ptr __n;
  Dictionary *settingsKey;
  int iVar1;
  long lVar2;
  _Base_ptr p_Var3;
  ConfigError *this_00;
  long *plVar4;
  size_type *psVar5;
  _func_int **pp_Var6;
  Dictionary *settings_00;
  Dictionary *settings_01;
  Dictionary *settings_02;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  string beginStringQualifier;
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  string frontKey;
  string local_1d0;
  string local_1b0;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  char local_170 [16];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  field_metrics local_140;
  DataDictionaryProvider *local_138;
  undefined1 local_130 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120 [4];
  _func_int **local_d8;
  _func_int **local_d0;
  SessionID *local_c8;
  Dictionary *local_c0;
  shared_ptr<FIX::DataDictionary> local_b8;
  undefined1 local_a8 [16];
  LogFactory *local_98;
  long local_88 [2];
  _Rb_tree_node_base *local_78;
  _Base_ptr local_70;
  _Rb_tree_node_base local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_130._0_8_ = local_120;
  local_138 = provider;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"TransportDataDictionary","");
  createDataDictionary((SessionFactory *)local_a8,(SessionID *)this,settings_00,(string *)settings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_,local_120[0]._M_allocated_capacity + 1);
  }
  local_b8.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8._0_8_;
  local_b8.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a8._8_8_ + 8) = *(_Atomic_word *)(local_a8._8_8_ + 8) + 1;
    }
  }
  DataDictionaryProvider::addTransportDataDictionary(local_138,&sessionID->m_beginString,&local_b8);
  local_c8 = (SessionID *)this;
  if (local_b8.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  p_Var3 = (settings->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68._M_left = &(settings->m_data)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c0 = settings;
  if (p_Var3 != local_68._M_left) {
    pp_Var6 = (_func_int **)(local_190 + 0x10);
    local_d0 = (_func_int **)&PTR__FieldBase_001f55c8;
    local_d8 = (_func_int **)&PTR__FieldBase_001f5568;
    do {
      __rhs = p_Var3 + 1;
      std::__cxx11::string::substr((ulong)&local_78,(ulong)__rhs);
      local_190._0_8_ = pp_Var6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"AppDataDictionary","");
      string_toUpper((string *)local_130,(string *)local_190);
      uVar7 = local_130._0_8_;
      if (local_70 == (_Base_ptr)local_130._8_8_) {
        if (local_70 == (_Base_ptr)0x0) {
          bVar9 = true;
        }
        else {
          iVar1 = bcmp(local_78,(void *)local_130._0_8_,(size_t)local_70);
          bVar9 = iVar1 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar7 != local_120) {
        operator_delete((void *)uVar7,local_120[0]._M_allocated_capacity + 1);
      }
      if ((_func_int **)local_190._0_8_ != pp_Var6) {
        operator_delete((void *)local_190._0_8_,(ulong)(local_180._M_allocated_capacity + 1));
      }
      if (bVar9) {
        local_190._0_8_ = pp_Var6;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"AppDataDictionary","");
        string_toUpper((string *)local_130,(string *)local_190);
        uVar7 = local_130._0_8_;
        __n = p_Var3[1]._M_parent;
        if (__n == (_Base_ptr)local_130._8_8_) {
          if (__n == (_Base_ptr)0x0) {
            bVar9 = true;
          }
          else {
            iVar1 = bcmp(*(void **)__rhs,(void *)local_130._0_8_,(size_t)__n);
            bVar9 = iVar1 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 != local_120) {
          operator_delete((void *)uVar7,local_120[0]._M_allocated_capacity + 1);
        }
        if ((_func_int **)local_190._0_8_ != pp_Var6) {
          operator_delete((void *)local_190._0_8_,(ulong)(local_180._M_allocated_capacity + 1));
        }
        if (bVar9) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,"DefaultApplVerID","");
          settingsKey = local_c0;
          Dictionary::getString(&local_1d0,local_c0,&local_1b0,false);
          local_190._0_8_ = local_d0;
          local_190._8_4_ = 8;
          local_180._M_allocated_capacity = (size_type)local_170;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_190 + 0x10),local_1d0._M_dataplus._M_p,
                     local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
          local_160._M_p = (pointer)&local_150;
          local_158 = 0;
          local_150._M_local_buf[0] = '\0';
          local_140.m_length = 0;
          local_140.m_checksum = 0;
          local_190._0_8_ = local_d8;
          Message::toApplVerID((ApplVerID *)local_130,(BeginString *)local_190);
          local_98 = (LogFactory *)local_88;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"AppDataDictionary","");
          createDataDictionary
                    ((SessionFactory *)&stack0xffffffffffffffc0,local_c8,settings_01,
                     (string *)settingsKey);
          DataDictionaryProvider::addApplicationDataDictionary
                    (local_138,(ApplVerID *)local_130,
                     (shared_ptr<FIX::DataDictionary> *)&stack0xffffffffffffffc0);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_98 != (LogFactory *)local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          FieldBase::~FieldBase((FieldBase *)local_130);
          FieldBase::~FieldBase((FieldBase *)local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_1b0.field_2._M_allocated_capacity;
          _Var8._M_p = local_1b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
LAB_001b2f8a:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        else {
          lVar2 = std::__cxx11::string::find((char)__rhs,0x2e);
          if (lVar2 == -1) {
            this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Malformed ","");
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
            local_1d0._M_dataplus._M_p = (pointer)*plVar4;
            psVar5 = (size_type *)(plVar4 + 2);
            if ((size_type *)local_1d0._M_dataplus._M_p == psVar5) {
              local_1d0.field_2._M_allocated_capacity = *psVar5;
              local_1d0.field_2._8_8_ = plVar4[3];
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar5;
            }
            local_1d0._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            local_190._0_8_ = *plVar4;
            pp_Var6 = (_func_int **)(plVar4 + 2);
            if ((_func_int **)local_190._0_8_ == pp_Var6) {
              local_180._M_allocated_capacity = (size_type)*pp_Var6;
              local_180._8_8_ = plVar4[3];
              local_190._0_8_ = local_190 + 0x10;
            }
            else {
              local_180._M_allocated_capacity = (size_type)*pp_Var6;
            }
            local_190._8_8_ = plVar4[1];
            *plVar4 = (long)pp_Var6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            ConfigError::ConfigError(this_00,(string *)local_130);
            __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          std::__cxx11::string::substr((ulong)&local_1d0,(ulong)__rhs);
          local_190._0_8_ = local_d0;
          local_190._8_4_ = 8;
          local_180._M_allocated_capacity = (size_type)local_170;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_190 + 0x10),local_1d0._M_dataplus._M_p,
                     local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
          local_160._M_p = (pointer)&local_150;
          local_158 = 0;
          local_150._M_local_buf[0] = '\0';
          local_140.m_length = 0;
          local_140.m_checksum = 0;
          local_190._0_8_ = local_d8;
          Message::toApplVerID((ApplVerID *)local_130,(BeginString *)local_190);
          createDataDictionary
                    ((SessionFactory *)&local_68._M_right,local_c8,settings_02,(string *)local_c0);
          DataDictionaryProvider::addApplicationDataDictionary
                    (local_138,(ApplVerID *)local_130,
                     (shared_ptr<FIX::DataDictionary> *)&local_68._M_right);
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          FieldBase::~FieldBase((FieldBase *)local_130);
          FieldBase::~FieldBase((FieldBase *)local_190);
          uVar7 = local_1d0.field_2._M_allocated_capacity;
          _Var8._M_p = local_1d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001b2f8a;
        }
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68._0_8_ + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_68._M_left);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  std::shared_ptr<DataDictionary> pDataDictionary
      = createDataDictionary(sessionID, settings, TRANSPORT_DATA_DICTIONARY);
  provider.addTransportDataDictionary(sessionID.getBeginString(), pDataDictionary);

  for (const Dictionary::value_type &data : settings) {
    const std::string &key = data.first;
    const std::string frontKey = key.substr(0, strlen(APP_DATA_DICTIONARY));
    if (frontKey == string_toUpper(APP_DATA_DICTIONARY)) {
      if (key == string_toUpper(APP_DATA_DICTIONARY)) {
        provider.addApplicationDataDictionary(
            Message::toApplVerID(settings.getString(DEFAULT_APPLVERID)),
            createDataDictionary(sessionID, settings, APP_DATA_DICTIONARY));
      } else {
        std::string::size_type offset = key.find('.');
        if (offset == std::string::npos) {
          throw ConfigError(std::string("Malformed ") + APP_DATA_DICTIONARY + ": " + key);
        }
        std::string beginStringQualifier = key.substr(offset + 1);
        provider.addApplicationDataDictionary(
            Message::toApplVerID(beginStringQualifier),
            createDataDictionary(sessionID, settings, key));
      }
    }
  }
}